

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCacheManager.cxx
# Opt level: O1

bool __thiscall
cmCacheManager::LoadCache
          (cmCacheManager *this,string *path,bool internal,
          set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *excludes,
          set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *includes)

{
  CacheEntryMap *this_00;
  _Rb_tree_header *p_Var1;
  _Base_ptr *pp_Var2;
  size_type *psVar3;
  pointer pcVar4;
  bool bVar5;
  int iVar6;
  const_iterator cVar7;
  ulong uVar8;
  iterator iVar9;
  mapped_type *pmVar10;
  size_t sVar11;
  long *plVar12;
  undefined8 *puVar13;
  ulong *puVar14;
  undefined7 in_register_00000011;
  undefined1 uVar15;
  long lVar16;
  char *pcVar17;
  _Base_ptr p_Var18;
  cmCacheManager *pcVar19;
  string message;
  uint v;
  CacheEntry e;
  string entryKey;
  string cacheFile;
  string buffer;
  ifstream fin;
  string local_480;
  string local_460;
  undefined4 local_440;
  allocator local_439;
  CacheEntry local_438;
  cmCacheManager *local_3d8;
  uint local_3cc;
  _Base_ptr *local_3c8;
  long local_3c0;
  _Base_ptr local_3b8;
  undefined4 uStack_3b0;
  undefined4 uStack_3ac;
  ulong *local_3a8;
  long local_3a0;
  ulong local_398;
  undefined4 uStack_390;
  undefined4 uStack_38c;
  string local_388;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_368;
  string *local_360;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_358;
  ulong *local_350;
  long local_348;
  ulong local_340;
  undefined4 uStack_338;
  undefined4 uStack_334;
  ulong *local_330;
  long local_328;
  ulong local_320 [2];
  ulong *local_310;
  long local_308;
  ulong local_300 [2];
  cmCacheManager *local_2f0 [2];
  undefined1 local_2e0 [16];
  _Base_ptr *local_2d0;
  long local_2c8;
  _Base_ptr local_2c0 [2];
  undefined1 local_2b0 [32];
  key_type local_290;
  CacheEntryMap *local_270;
  _Base_ptr local_268;
  _Base_ptr local_260;
  long *local_258 [2];
  long local_248 [2];
  long local_238 [4];
  byte abStack_218 [488];
  
  local_2f0[0] = (cmCacheManager *)local_2e0;
  pcVar4 = (path->_M_dataplus)._M_p;
  local_358 = &excludes->_M_t;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_2f0,pcVar4,pcVar4 + path->_M_string_length);
  std::__cxx11::string::append((char *)local_2f0);
  if (internal) {
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCacheManager::CacheEntry>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCacheManager::CacheEntry>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCacheManager::CacheEntry>_>_>
    ::clear(&(this->Cache)._M_t);
  }
  pcVar19 = local_2f0[0];
  bVar5 = cmsys::SystemTools::FileExists((char *)local_2f0[0]);
  if (!bVar5) {
    CleanCMakeFiles(pcVar19,path);
    uVar15 = 0;
    goto LAB_002bfcf1;
  }
  std::ifstream::ifstream(local_238,(char *)local_2f0[0],_S_in);
  bVar5 = (abStack_218[*(long *)(local_238[0] + -0x18)] & 5) == 0;
  uVar8 = CONCAT71((int7)((ulong)local_2f0 >> 8),bVar5);
  if (bVar5) {
    local_440 = (undefined4)CONCAT71(in_register_00000011,internal);
    local_3cc = (uint)uVar8;
    local_2b0._0_8_ = local_2b0 + 0x10;
    local_2b0._8_8_ = 0;
    local_2b0[0x10] = '\0';
    local_388._M_dataplus._M_p = (pointer)&local_388.field_2;
    local_388._M_string_length = 0;
    local_388.field_2._M_local_buf[0] = '\0';
    local_3d8 = this;
    local_368 = &includes->_M_t;
    local_360 = path;
    if ((abStack_218[*(long *)(local_238[0] + -0x18)] & 5) == 0) {
      local_260 = &(((_Rep_type *)&local_358->_M_impl)->_M_impl).super__Rb_tree_header._M_header;
      local_268 = &(includes->_M_t)._M_impl.super__Rb_tree_header._M_header;
      local_270 = &this->Cache;
      do {
        local_460._M_dataplus._M_p = (pointer)&local_460.field_2;
        local_460._M_string_length = 0;
        local_460.field_2._M_local_buf[0] = '\0';
        local_438.Value._M_dataplus._M_p = (pointer)&local_438.Value.field_2;
        local_438.Value._M_string_length = 0;
        local_438.Value.field_2._M_local_buf[0] = '\0';
        local_438.Type = UNINITIALIZED;
        local_438.Properties.
        super_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmProperty,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmProperty>_>_>
        ._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
        local_438.Properties.
        super_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmProperty,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmProperty>_>_>
        ._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
        local_438.Properties.
        super_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmProperty,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmProperty>_>_>
        ._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
             &local_438.Properties.
              super_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmProperty,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmProperty>_>_>
              ._M_t._M_impl.super__Rb_tree_header._M_header;
        local_438.Properties.
        super_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmProperty,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmProperty>_>_>
        ._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
        local_438.Initialized = false;
        local_438.Properties.
        super_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmProperty,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmProperty>_>_>
        ._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
             local_438.Properties.
             super_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmProperty,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmProperty>_>_>
             ._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        cmsys::SystemTools::GetLineFromStream
                  ((istream *)local_238,(string *)local_2b0,(bool *)0x0,-1);
        p_Var18 = (_Base_ptr)local_2b0._0_8_;
        while (uVar8 = (ulong)(byte)(char)p_Var18->_M_color, uVar8 < 0x24) {
          if ((0x100002600U >> (uVar8 & 0x3f) & 1) == 0) {
            if ((0x800000001U >> (uVar8 & 0x3f) & 1) != 0) goto LAB_002bf2ae;
            break;
          }
          p_Var18 = (_Base_ptr)((long)&p_Var18->_M_color + 1);
        }
        while (((char)p_Var18->_M_color == 0x2f && (*(byte *)((long)&p_Var18->_M_color + 1) == 0x2f)
               )) {
          if ((*(byte *)((long)&p_Var18->_M_color + 2) == 0x5c) &&
             (*(byte *)((long)&p_Var18->_M_color + 3) == 0x6e)) {
            std::__cxx11::string::append((char *)&local_460);
          }
          std::__cxx11::string::append((char *)&local_460);
          cmsys::SystemTools::GetLineFromStream
                    ((istream *)local_238,(string *)local_2b0,(bool *)0x0,-1);
          p_Var18 = (_Base_ptr)local_2b0._0_8_;
        }
        local_480._M_dataplus._M_p = (pointer)&local_480.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_480,"HELPSTRING","");
        CacheEntry::SetProperty(&local_438,&local_480,local_460._M_dataplus._M_p);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_480._M_dataplus._M_p != &local_480.field_2) {
          operator_delete(local_480._M_dataplus._M_p,local_480.field_2._M_allocated_capacity + 1);
        }
        local_480._M_dataplus._M_p = (pointer)&local_480.field_2;
        sVar11 = strlen((char *)p_Var18);
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_480,p_Var18,(char *)((long)&p_Var18->_M_color + sVar11));
        bVar5 = ParseEntry(&local_480,&local_388,&local_438.Value,&local_438.Type);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_480._M_dataplus._M_p != &local_480.field_2) {
          operator_delete(local_480._M_dataplus._M_p,local_480.field_2._M_allocated_capacity + 1);
        }
        if (bVar5) {
          iVar9 = std::
                  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::find(local_358,&local_388);
          if ((iVar9._M_node == local_260) &&
             ((((char)local_440 != '\0' || (local_438.Type != INTERNAL)) ||
              (iVar9 = std::
                       _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ::find(local_368,&local_388), iVar9._M_node != local_268)))) {
            if ((char)local_440 == '\0') {
              local_438.Type = INTERNAL;
              std::__cxx11::string::_M_replace
                        ((ulong)&local_460,0,(char *)local_460._M_string_length,0x4bf982);
              std::__cxx11::string::_M_append((char *)&local_460,(ulong)local_388._M_dataplus._M_p);
              std::__cxx11::string::append((char *)&local_460);
              std::__cxx11::string::_M_append
                        ((char *)&local_460,(ulong)(local_360->_M_dataplus)._M_p);
              std::__cxx11::string::append((char *)&local_460);
              local_480._M_dataplus._M_p = (pointer)&local_480.field_2;
              std::__cxx11::string::_M_construct<char_const*>((string *)&local_480,"HELPSTRING","");
              CacheEntry::SetProperty(&local_438,&local_480,local_460._M_dataplus._M_p);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_480._M_dataplus._M_p != &local_480.field_2) {
                operator_delete(local_480._M_dataplus._M_p,
                                local_480.field_2._M_allocated_capacity + 1);
              }
            }
            bVar5 = ReadPropertyEntry(local_3d8,&local_388,&local_438);
            if (!bVar5) {
              local_438.Initialized = true;
              pmVar10 = std::
                        map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCacheManager::CacheEntry,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCacheManager::CacheEntry>_>_>
                        ::operator[](local_270,&local_388);
              std::__cxx11::string::_M_assign((string *)pmVar10);
              pmVar10->Type = local_438.Type;
              std::
              _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmProperty>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmProperty>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmProperty>_>_>
              ::operator=((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmProperty>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmProperty>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmProperty>_>_>
                           *)&pmVar10->Properties,
                          (_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmProperty>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmProperty>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmProperty>_>_>
                           *)&local_438.Properties);
              pmVar10->Initialized = local_438.Initialized;
            }
          }
        }
        else {
          cmSystemTools::Error
                    ("Parse error in cache file ",(char *)local_2f0[0],". Offending entry: ",
                     (char *)p_Var18);
        }
LAB_002bf2ae:
        std::
        _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmProperty>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmProperty>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmProperty>_>_>
        ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmProperty>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmProperty>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmProperty>_>_>
                     *)&local_438.Properties);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_438.Value._M_dataplus._M_p != &local_438.Value.field_2) {
          operator_delete(local_438.Value._M_dataplus._M_p,
                          CONCAT71(local_438.Value.field_2._M_allocated_capacity._1_7_,
                                   local_438.Value.field_2._M_local_buf[0]) + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_460._M_dataplus._M_p != &local_460.field_2) {
          operator_delete(local_460._M_dataplus._M_p,
                          CONCAT71(local_460.field_2._M_allocated_capacity._1_7_,
                                   local_460.field_2._M_local_buf[0]) + 1);
        }
      } while ((abStack_218[*(long *)(local_238[0] + -0x18)] & 5) == 0);
    }
    pcVar19 = local_3d8;
    local_3d8->CacheMajorVersion = 0;
    local_3d8->CacheMinorVersion = 0;
    local_438.Value._M_dataplus._M_p = (pointer)&local_438.Value.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_438,"CMAKE_CACHE_MAJOR_VERSION","");
    this_00 = &pcVar19->Cache;
    cVar7 = std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCacheManager::CacheEntry>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCacheManager::CacheEntry>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCacheManager::CacheEntry>_>_>
            ::find(&this_00->_M_t,&local_438.Value);
    p_Var1 = &(pcVar19->Cache)._M_t._M_impl.super__Rb_tree_header;
    if (((_Rb_tree_header *)cVar7._M_node == p_Var1) ||
       (*(char *)&cVar7._M_node[4]._M_right != '\x01')) {
      lVar16 = 0;
    }
    else {
      lVar16 = *(long *)(cVar7._M_node + 2);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_438.Value._M_dataplus._M_p != &local_438.Value.field_2) {
      operator_delete(local_438.Value._M_dataplus._M_p,
                      CONCAT71(local_438.Value.field_2._M_allocated_capacity._1_7_,
                               local_438.Value.field_2._M_local_buf[0]) + 1);
    }
    if (lVar16 == 0) {
      local_438.Value._M_dataplus._M_p = (pointer)&local_438.Value.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_438,"CMAKE_CACHE_MINOR_VERSION","");
      AddCacheEntry(pcVar19,&local_438.Value,"0",
                    "Minor version of cmake used to create the current loaded cache",INTERNAL);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_438.Value._M_dataplus._M_p != &local_438.Value.field_2) {
        operator_delete(local_438.Value._M_dataplus._M_p,
                        CONCAT71(local_438.Value.field_2._M_allocated_capacity._1_7_,
                                 local_438.Value.field_2._M_local_buf[0]) + 1);
      }
      local_438.Value._M_dataplus._M_p = (pointer)&local_438.Value.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_438,"CMAKE_CACHE_MAJOR_VERSION","");
      AddCacheEntry(pcVar19,&local_438.Value,"0",
                    "Major version of cmake used to create the current loaded cache",INTERNAL);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_438.Value._M_dataplus._M_p != &local_438.Value.field_2) {
        operator_delete(local_438.Value._M_dataplus._M_p,
                        CONCAT71(local_438.Value.field_2._M_allocated_capacity._1_7_,
                                 local_438.Value.field_2._M_local_buf[0]) + 1);
      }
    }
    else {
      local_460._M_dataplus._M_p = local_460._M_dataplus._M_p & 0xffffffff00000000;
      iVar6 = __isoc99_sscanf(lVar16,"%u");
      if (iVar6 == 1) {
        pcVar19->CacheMajorVersion = (uint)local_460._M_dataplus._M_p;
      }
      local_438.Value._M_dataplus._M_p = (pointer)&local_438.Value.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_438,"CMAKE_CACHE_MINOR_VERSION","");
      cVar7 = std::
              _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCacheManager::CacheEntry>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCacheManager::CacheEntry>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCacheManager::CacheEntry>_>_>
              ::find(&this_00->_M_t,&local_438.Value);
      if (((_Rb_tree_header *)cVar7._M_node == p_Var1) ||
         (*(char *)&cVar7._M_node[4]._M_right != '\x01')) {
        lVar16 = 0;
      }
      else {
        lVar16 = *(long *)(cVar7._M_node + 2);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_438.Value._M_dataplus._M_p != &local_438.Value.field_2) {
        operator_delete(local_438.Value._M_dataplus._M_p,
                        CONCAT71(local_438.Value.field_2._M_allocated_capacity._1_7_,
                                 local_438.Value.field_2._M_local_buf[0]) + 1);
      }
      if ((lVar16 != 0) && (iVar6 = __isoc99_sscanf(lVar16,"%u",&local_460), iVar6 == 1)) {
        pcVar19->CacheMinorVersion = (uint)local_460._M_dataplus._M_p;
      }
    }
    local_438.Value._M_dataplus._M_p = (pointer)&local_438.Value.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_438,"CMAKE_CACHEFILE_DIR","");
    cVar7 = std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCacheManager::CacheEntry>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCacheManager::CacheEntry>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCacheManager::CacheEntry>_>_>
            ::find(&this_00->_M_t,&local_438.Value);
    if (((_Rb_tree_header *)cVar7._M_node == p_Var1) ||
       (*(char *)&cVar7._M_node[4]._M_right != '\x01')) {
      pcVar17 = (char *)0x0;
    }
    else {
      pcVar17 = *(char **)(cVar7._M_node + 2);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_438.Value._M_dataplus._M_p != &local_438.Value.field_2) {
      operator_delete(local_438.Value._M_dataplus._M_p,
                      CONCAT71(local_438.Value.field_2._M_allocated_capacity._1_7_,
                               local_438.Value.field_2._M_local_buf[0]) + 1);
    }
    if ((char)local_440 == '\x01' && pcVar17 != (char *)0x0) {
      local_438.Value._M_dataplus._M_p = (pointer)&local_438.Value.field_2;
      pcVar4 = (local_360->_M_dataplus)._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_438,pcVar4,pcVar4 + local_360->_M_string_length);
      local_460._M_dataplus._M_p = (pointer)&local_460.field_2;
      sVar11 = strlen(pcVar17);
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_460,pcVar17,pcVar17 + sVar11)
      ;
      cmsys::SystemTools::ConvertToUnixSlashes(&local_438.Value);
      std::__cxx11::string::append((char *)&local_438);
      std::__cxx11::string::append((char *)&local_460);
      bVar5 = cmsys::SystemTools::SameFile(&local_460,&local_438.Value);
      if (!bVar5) {
        local_258[0] = local_248;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_258,"The current CMakeCache.txt directory ","");
        plVar12 = (long *)std::__cxx11::string::_M_append
                                    ((char *)local_258,(ulong)local_438.Value._M_dataplus._M_p);
        puVar14 = (ulong *)(plVar12 + 2);
        if ((ulong *)*plVar12 == puVar14) {
          local_340 = *puVar14;
          uStack_338 = (undefined4)plVar12[3];
          uStack_334 = *(undefined4 *)((long)plVar12 + 0x1c);
          local_350 = &local_340;
        }
        else {
          local_340 = *puVar14;
          local_350 = (ulong *)*plVar12;
        }
        local_348 = plVar12[1];
        *plVar12 = (long)puVar14;
        plVar12[1] = 0;
        *(undefined1 *)(plVar12 + 2) = 0;
        local_310 = local_300;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_310," is different than the directory ","");
        uVar8 = 0xf;
        if (local_350 != &local_340) {
          uVar8 = local_340;
        }
        if (uVar8 < (ulong)(local_308 + local_348)) {
          uVar8 = 0xf;
          if (local_310 != local_300) {
            uVar8 = local_300[0];
          }
          if (uVar8 < (ulong)(local_308 + local_348)) goto LAB_002bf8a6;
          puVar13 = (undefined8 *)
                    std::__cxx11::string::replace((ulong)&local_310,0,(char *)0x0,(ulong)local_350);
        }
        else {
LAB_002bf8a6:
          puVar13 = (undefined8 *)
                    std::__cxx11::string::_M_append((char *)&local_350,(ulong)local_310);
        }
        local_3c8 = &local_3b8;
        pp_Var2 = (_Base_ptr *)(puVar13 + 2);
        if ((_Base_ptr *)*puVar13 == pp_Var2) {
          local_3b8 = *pp_Var2;
          uStack_3b0 = *(undefined4 *)(puVar13 + 3);
          uStack_3ac = *(undefined4 *)((long)puVar13 + 0x1c);
        }
        else {
          local_3b8 = *pp_Var2;
          local_3c8 = (_Base_ptr *)*puVar13;
        }
        local_3c0 = puVar13[1];
        *puVar13 = pp_Var2;
        puVar13[1] = 0;
        *(undefined1 *)pp_Var2 = 0;
        local_290._M_dataplus._M_p = (pointer)&local_290.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_290,"CMAKE_CACHEFILE_DIR","");
        cVar7 = std::
                _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCacheManager::CacheEntry>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCacheManager::CacheEntry>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCacheManager::CacheEntry>_>_>
                ::find(&this_00->_M_t,&local_290);
        if (((_Rb_tree_header *)cVar7._M_node == p_Var1) ||
           (*(char *)&cVar7._M_node[4]._M_right != '\x01')) {
          pcVar17 = (char *)0x0;
        }
        else {
          pcVar17 = *(char **)(cVar7._M_node + 2);
        }
        std::__cxx11::string::string((string *)&local_2d0,pcVar17,&local_439);
        p_Var18 = (_Base_ptr)0xf;
        if (local_3c8 != &local_3b8) {
          p_Var18 = local_3b8;
        }
        if (p_Var18 < (_Base_ptr)(local_2c8 + local_3c0)) {
          p_Var18 = (_Base_ptr)0xf;
          if (local_2d0 != local_2c0) {
            p_Var18 = local_2c0[0];
          }
          if (p_Var18 < (_Base_ptr)(local_2c8 + local_3c0)) goto LAB_002bf9d3;
          puVar13 = (undefined8 *)
                    std::__cxx11::string::replace((ulong)&local_2d0,0,(char *)0x0,(ulong)local_3c8);
        }
        else {
LAB_002bf9d3:
          puVar13 = (undefined8 *)
                    std::__cxx11::string::_M_append((char *)&local_3c8,(ulong)local_2d0);
        }
        local_3a8 = &local_398;
        puVar14 = puVar13 + 2;
        if ((ulong *)*puVar13 == puVar14) {
          local_398 = *puVar14;
          uStack_390 = *(undefined4 *)(puVar13 + 3);
          uStack_38c = *(undefined4 *)((long)puVar13 + 0x1c);
        }
        else {
          local_398 = *puVar14;
          local_3a8 = (ulong *)*puVar13;
        }
        local_3a0 = puVar13[1];
        *puVar13 = puVar14;
        puVar13[1] = 0;
        *(undefined1 *)puVar14 = 0;
        local_330 = local_320;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_330,
                   " where CMakeCache.txt was created. This may result in binaries being created in the wrong place. If you are not sure, reedit the CMakeCache.txt"
                   ,"");
        uVar8 = 0xf;
        if (local_3a8 != &local_398) {
          uVar8 = local_398;
        }
        if (uVar8 < (ulong)(local_328 + local_3a0)) {
          uVar8 = 0xf;
          if (local_330 != local_320) {
            uVar8 = local_320[0];
          }
          if (uVar8 < (ulong)(local_328 + local_3a0)) goto LAB_002bfac5;
          puVar13 = (undefined8 *)
                    std::__cxx11::string::replace((ulong)&local_330,0,(char *)0x0,(ulong)local_3a8);
        }
        else {
LAB_002bfac5:
          puVar13 = (undefined8 *)
                    std::__cxx11::string::_M_append((char *)&local_3a8,(ulong)local_330);
        }
        local_480._M_dataplus._M_p = (pointer)&local_480.field_2;
        psVar3 = puVar13 + 2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar13 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar3) {
          local_480.field_2._M_allocated_capacity = *psVar3;
          local_480.field_2._8_8_ = puVar13[3];
        }
        else {
          local_480.field_2._M_allocated_capacity = *psVar3;
          local_480._M_dataplus._M_p = (pointer)*puVar13;
        }
        local_480._M_string_length = puVar13[1];
        *puVar13 = psVar3;
        puVar13[1] = 0;
        *(undefined1 *)psVar3 = 0;
        if (local_330 != local_320) {
          operator_delete(local_330,local_320[0] + 1);
        }
        if (local_3a8 != &local_398) {
          operator_delete(local_3a8,local_398 + 1);
        }
        if (local_2d0 != local_2c0) {
          operator_delete(local_2d0,(ulong)((long)&local_2c0[0]->_M_color + 1));
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_290._M_dataplus._M_p != &local_290.field_2) {
          operator_delete(local_290._M_dataplus._M_p,local_290.field_2._M_allocated_capacity + 1);
        }
        if (local_3c8 != &local_3b8) {
          operator_delete(local_3c8,(ulong)((long)&local_3b8->_M_color + 1));
        }
        if (local_310 != local_300) {
          operator_delete(local_310,local_300[0] + 1);
        }
        if (local_350 != &local_340) {
          operator_delete(local_350,local_340 + 1);
        }
        if (local_258[0] != local_248) {
          operator_delete(local_258[0],local_248[0] + 1);
        }
        cmSystemTools::Error(local_480._M_dataplus._M_p,(char *)0x0,(char *)0x0,(char *)0x0);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_480._M_dataplus._M_p != &local_480.field_2) {
          operator_delete(local_480._M_dataplus._M_p,local_480.field_2._M_allocated_capacity + 1);
        }
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_460._M_dataplus._M_p != &local_460.field_2) {
        operator_delete(local_460._M_dataplus._M_p,
                        CONCAT71(local_460.field_2._M_allocated_capacity._1_7_,
                                 local_460.field_2._M_local_buf[0]) + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_438.Value._M_dataplus._M_p != &local_438.Value.field_2) {
        operator_delete(local_438.Value._M_dataplus._M_p,
                        CONCAT71(local_438.Value.field_2._M_allocated_capacity._1_7_,
                                 local_438.Value.field_2._M_local_buf[0]) + 1);
      }
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_388._M_dataplus._M_p != &local_388.field_2) {
      operator_delete(local_388._M_dataplus._M_p,
                      CONCAT71(local_388.field_2._M_allocated_capacity._1_7_,
                               local_388.field_2._M_local_buf[0]) + 1);
    }
    uVar8 = (ulong)local_3cc;
    if ((_Base_ptr)local_2b0._0_8_ != (_Base_ptr)(local_2b0 + 0x10)) {
      operator_delete((void *)local_2b0._0_8_,CONCAT71(local_2b0._17_7_,local_2b0[0x10]) + 1);
    }
  }
  uVar15 = (undefined1)uVar8;
  std::ifstream::~ifstream(local_238);
LAB_002bfcf1:
  if (local_2f0[0] != (cmCacheManager *)local_2e0) {
    operator_delete(local_2f0[0],local_2e0._0_8_ + 1);
  }
  return (bool)uVar15;
}

Assistant:

bool cmCacheManager::LoadCache(const std::string& path,
                               bool internal,
                               std::set<std::string>& excludes,
                               std::set<std::string>& includes)
{
  std::string cacheFile = path;
  cacheFile += "/CMakeCache.txt";
  // clear the old cache, if we are reading in internal values
  if ( internal )
    {
    this->Cache.clear();
    }
  if(!cmSystemTools::FileExists(cacheFile.c_str()))
    {
    this->CleanCMakeFiles(path);
    return false;
    }

  cmsys::ifstream fin(cacheFile.c_str());
  if(!fin)
    {
    return false;
    }
  const char *realbuffer;
  std::string buffer;
  std::string entryKey;
  while(fin)
    {
    // Format is key:type=value
    std::string helpString;
    CacheEntry e;
    cmSystemTools::GetLineFromStream(fin, buffer);
    realbuffer = buffer.c_str();
    while(*realbuffer != '0' &&
          (*realbuffer == ' ' ||
           *realbuffer == '\t' ||
           *realbuffer == '\r' ||
           *realbuffer == '\n'))
      {
      realbuffer++;
      }
    // skip blank lines and comment lines
    if(realbuffer[0] == '#' || realbuffer[0] == 0)
      {
      continue;
      }
    while(realbuffer[0] == '/' && realbuffer[1] == '/')
      {
      if ((realbuffer[2] == '\\') && (realbuffer[3]=='n'))
        {
        helpString += "\n";
        helpString += &realbuffer[4];
        }
      else
        {
        helpString += &realbuffer[2];
        }
      cmSystemTools::GetLineFromStream(fin, buffer);
      realbuffer = buffer.c_str();
      if(!fin)
        {
        continue;
        }
      }
    e.SetProperty("HELPSTRING", helpString.c_str());
    if(cmCacheManager::ParseEntry(realbuffer, entryKey, e.Value, e.Type))
      {
      if ( excludes.find(entryKey) == excludes.end() )
        {
        // Load internal values if internal is set.
        // If the entry is not internal to the cache being loaded
        // or if it is in the list of internal entries to be
        // imported, load it.
        if ( internal || (e.Type != cmState::INTERNAL) ||
             (includes.find(entryKey) != includes.end()) )
          {
          // If we are loading the cache from another project,
          // make all loaded entries internal so that it is
          // not visible in the gui
          if (!internal)
            {
            e.Type = cmState::INTERNAL;
            helpString = "DO NOT EDIT, ";
            helpString += entryKey;
            helpString += " loaded from external file.  "
              "To change this value edit this file: ";
            helpString += path;
            helpString += "/CMakeCache.txt"   ;
            e.SetProperty("HELPSTRING", helpString.c_str());
            }
          if(!this->ReadPropertyEntry(entryKey, e))
            {
            e.Initialized = true;
            this->Cache[entryKey] = e;
            }
          }
        }
      }
    else
      {
      cmSystemTools::Error("Parse error in cache file ", cacheFile.c_str(),
                           ". Offending entry: ", realbuffer);
      }
    }
  this->CacheMajorVersion = 0;
  this->CacheMinorVersion = 0;
  if(const char* cmajor =
                  this->GetInitializedCacheValue("CMAKE_CACHE_MAJOR_VERSION"))
    {
    unsigned int v=0;
    if(sscanf(cmajor, "%u", &v) == 1)
      {
      this->CacheMajorVersion = v;
      }
    if(const char* cminor =
                  this->GetInitializedCacheValue("CMAKE_CACHE_MINOR_VERSION"))
      {
      if(sscanf(cminor, "%u", &v) == 1)
        {
        this->CacheMinorVersion = v;
        }
      }
    }
  else
    {
    // CMake version not found in the list file.
    // Set as version 0.0
    this->AddCacheEntry("CMAKE_CACHE_MINOR_VERSION", "0",
                        "Minor version of cmake used to create the "
                        "current loaded cache", cmState::INTERNAL);
    this->AddCacheEntry("CMAKE_CACHE_MAJOR_VERSION", "0",
                        "Major version of cmake used to create the "
                        "current loaded cache", cmState::INTERNAL);

    }
  // check to make sure the cache directory has not
  // been moved
  const char* oldDir = this->GetInitializedCacheValue("CMAKE_CACHEFILE_DIR");
  if (internal && oldDir)
    {
    std::string currentcwd = path;
    std::string oldcwd = oldDir;
    cmSystemTools::ConvertToUnixSlashes(currentcwd);
    currentcwd += "/CMakeCache.txt";
    oldcwd += "/CMakeCache.txt";
    if(!cmSystemTools::SameFile(oldcwd, currentcwd))
      {
      std::string message =
        std::string("The current CMakeCache.txt directory ") +
        currentcwd + std::string(" is different than the directory ") +
        std::string(this->GetInitializedCacheValue("CMAKE_CACHEFILE_DIR")) +
        std::string(" where CMakeCache.txt was created. This may result "
                    "in binaries being created in the wrong place. If you "
                    "are not sure, reedit the CMakeCache.txt");
      cmSystemTools::Error(message.c_str());
      }
    }
  return true;
}